

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall chrono::ChCamera::ChCamera(ChCamera *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar1 = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  this->_vptr_ChCamera = (_func_int **)&PTR__ChCamera_0118d178;
  *(undefined1 (*) [16])(this->position).m_data = auVar1;
  (this->position).m_data[2] = 1.0;
  auVar3._8_8_ = DAT_011dd3e8;
  auVar3._0_8_ = DAT_011dd3e8;
  auVar3._16_8_ = DAT_011dd3e8;
  auVar3._24_8_ = DAT_011dd3e8;
  auVar4._8_8_ = VECT_Y;
  auVar4._0_8_ = VECT_Y;
  auVar4._16_8_ = VECT_Y;
  auVar4._24_8_ = VECT_Y;
  auVar3 = vblendps_avx(ZEXT1632(_VNULL),auVar3,0x30);
  auVar3 = vblendps_avx(auVar3,auVar4,0xc0);
  this->aimpoint = (ChVector<double>)auVar3._0_24_;
  dVar2 = DAT_011dd418;
  (this->upvector).m_data[0] = (double)auVar3._24_8_;
  (this->upvector).m_data[1] = DAT_011dd410;
  (this->upvector).m_data[2] = dVar2;
  this->angle = 50.0;
  this->fov = 3.0;
  this->hvratio = 1.3333333333333333;
  this->isometric = false;
  this->m_owner = (ChPhysicsItem *)0x0;
  return;
}

Assistant:

inline ChVector<Real>::ChVector(Real x, Real y, Real z) {
    m_data[0] = x;
    m_data[1] = y;
    m_data[2] = z;
}